

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener_buffer.c
# Opt level: O2

void ht_listener_buffer_process_serialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  size_t sVar3;
  
  if (buffer->max_size != 0) {
    uVar2 = 0;
    while (uVar1 = size - uVar2, uVar2 <= size && uVar1 != 0) {
      __n = buffer->max_size - buffer->usage;
      if (uVar1 < __n) {
        __n = uVar1;
      }
      memcpy(buffer->data + buffer->usage,events + uVar2,__n);
      uVar2 = uVar2 + __n;
      sVar3 = __n + buffer->usage;
      buffer->usage = sVar3;
      if (sVar3 == buffer->max_size) {
        (*flush_callback)(listener,buffer->data,sVar3);
        buffer->usage = 0;
      }
    }
    return;
  }
  (*flush_callback)(listener,events,size);
  return;
}

Assistant:

void
ht_listener_buffer_process_serialized_events(HT_ListenerBuffer* buffer,
                                             TEventPtr events,
                                             size_t size,
                                             HT_ListenerFlushCallback flush_callback,
                                             void* listener)
{
    size_t written = 0;

    if (HT_IS_BYPASS_MODE(buffer))
    {
        flush_callback(listener, events, size);
        return;
    }

    while (written < size)
    {
        size_t actual_size = HT_MIN(size - written, buffer->max_size - buffer->usage);
        memcpy(buffer->data + buffer->usage, events + written, actual_size);
        written += actual_size;
        buffer->usage+= actual_size;

        if (buffer->usage == buffer->max_size)
        {
            ht_listener_buffer_flush(buffer, flush_callback, listener);
        }
    }
}